

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_stq_env_A0(DisasContext *s,int offset)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)(s->tmp1_i64 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uint)offset);
  tcg_gen_qemu_st_i64_x86_64(tcg_ctx,s->tmp1_i64,s->A0,(long)s->mem_index,MO_64);
  return;
}

Assistant:

static inline void gen_stq_env_A0(DisasContext *s, int offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, offset);
    tcg_gen_qemu_st_i64(tcg_ctx, s->tmp1_i64, s->A0, s->mem_index, MO_LEQ);
}